

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operators_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4b627::der_operators_sigmoid_Test::~der_operators_sigmoid_Test
          (der_operators_sigmoid_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(der_operators, sigmoid)
    {
        // y = 1 / (1 + e^-x)
        // y' = y(1-y)
        typedef op_minus<constant<C_ZERO>, variant> _x;
        typedef op_power<constant<E>, _x> e_x;
        typedef op_div<constant<C0>, op_plus<constant<C0>, e_x>> func;
        ASSERT_FLOAT_EQ(func::f(0.0f), 0.5f);
        for (double x = -5.0; x <= 5.0; x += 0.1)
        {
            double f = func::f(x);
            EXPECT_FLOAT_EQ(func::d(x), f*(1-f));
        }
    }